

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_prespch_buf.c
# Opt level: O1

int fe_prespch_read_cep(prespch_buf_t *prespch_buf,mfcc_t *feat)

{
  if (prespch_buf->ncep != 0) {
    memcpy(feat,prespch_buf->cep_buf[prespch_buf->cep_read_ptr],(long)prespch_buf->num_cepstra << 2)
    ;
    prespch_buf->cep_read_ptr =
         (int16)((prespch_buf->cep_read_ptr + 1) % (int)prespch_buf->num_frames_cep);
    prespch_buf->ncep = prespch_buf->ncep + -1;
    return 1;
  }
  return 0;
}

Assistant:

int
fe_prespch_read_cep(prespch_buf_t * prespch_buf, mfcc_t * feat)
{
    if (prespch_buf->ncep == 0)
        return 0;
    memcpy(feat, prespch_buf->cep_buf[prespch_buf->cep_read_ptr],
           sizeof(mfcc_t) * prespch_buf->num_cepstra);
    prespch_buf->cep_read_ptr = (prespch_buf->cep_read_ptr + 1) % prespch_buf->num_frames_cep;
    prespch_buf->ncep--;
    return 1;
}